

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.hpp
# Opt level: O0

void __thiscall
deqp::gls::ShaderExecUtil::Symbol::Symbol(Symbol *this,string *name_,VarType *varType_)

{
  VarType *varType__local;
  string *name__local;
  Symbol *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)name_);
  glu::VarType::VarType(&this->varType,varType_);
  return;
}

Assistant:

Symbol (const std::string& name_, const glu::VarType& varType_) : name(name_), varType(varType_) {}